

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::CollectTargetDepends(cmComputeTargetDepends *this,int depender_index)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  uint uVar3;
  reference ppcVar4;
  reference pbVar5;
  reference ppcVar6;
  cmake *this_01;
  cmLinkImplementation *this_02;
  reference pcVar7;
  string *psVar8;
  reference pcVar9;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  byte local_2a1;
  _Self local_258;
  _Self local_250;
  const_iterator util;
  undefined1 local_238 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted_1;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *tutils;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_1e0;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_1d8;
  const_iterator lib;
  cmLinkImplementation *impl;
  cmListFileBacktrace local_1b0;
  allocator local_169;
  string local_168;
  _Base_ptr local_148;
  undefined1 local_140;
  _Base_ptr local_138;
  undefined1 local_130;
  undefined1 local_128 [8];
  string objLib;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_100;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_f8;
  const_iterator oi;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectFiles;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  const_iterator it;
  value_type local_b8;
  string local_88;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  cmGeneratorTarget *depender;
  int depender_index_local;
  cmComputeTargetDepends *this_local;
  
  ppcVar4 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator[](&this->Targets,(long)depender_index);
  this_00 = *ppcVar4;
  TVar2 = cmGeneratorTarget::GetType(this_00);
  if (TVar2 != INTERFACE_LIBRARY) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68);
    cmMakefile::GetConfigurations
              (&local_88,this_00->Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_68,true);
    std::__cxx11::string::~string((string *)&local_88);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,"",(allocator *)((long)&it._M_current + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    }
    local_d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_68);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_c8,&local_d0);
    while( true ) {
      objectFiles.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_68);
      bVar1 = __gnu_cxx::operator!=
                        (&local_c8,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&objectFiles.
                             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&oi);
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_c8);
      cmGeneratorTarget::GetExternalObjects
                (this_00,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&oi,
                 pbVar5);
      local_100._M_current =
           (cmSourceFile **)
           std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&oi);
      __gnu_cxx::
      __normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
      ::__normal_iterator<cmSourceFile_const**>
                ((__normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                  *)&local_f8,&local_100);
      while( true ) {
        objLib.field_2._8_8_ =
             std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&oi);
        bVar1 = __gnu_cxx::operator!=
                          (&local_f8,
                           (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                            *)((long)&objLib.field_2 + 8));
        if (!bVar1) break;
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                  ::operator*(&local_f8);
        cmSourceFile::GetObjectLibrary_abi_cxx11_((string *)local_128,*ppcVar6);
        uVar3 = std::__cxx11::string::empty();
        local_2a1 = 0;
        if ((uVar3 & 1) == 0) {
          pVar10 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&configs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (value_type *)local_128);
          local_148 = (_Base_ptr)pVar10.first._M_node;
          local_2a1 = pVar10.second;
          local_140 = local_2a1;
          local_138 = local_148;
          local_130 = local_2a1;
        }
        if ((local_2a1 & 1) == 0) {
LAB_007874a1:
          bVar1 = false;
        }
        else {
          TVar2 = cmGeneratorTarget::GetType(this_00);
          if ((((TVar2 == EXECUTABLE) ||
               (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 == STATIC_LIBRARY)) ||
              (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 == SHARED_LIBRARY)) ||
             (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 == MODULE_LIBRARY)) {
            cmTarget::AddUtility(this_00->Target,(string *)local_128,(cmMakefile *)0x0);
            goto LAB_007874a1;
          }
          this_01 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_168,
                     "Only executables and non-OBJECT libraries may reference target objects.",
                     &local_169);
          cmGeneratorTarget::GetBacktrace(&local_1b0,this_00);
          cmake::IssueMessage(this_01,FATAL_ERROR,&local_168,&local_1b0,false);
          cmListFileBacktrace::~cmListFileBacktrace(&local_1b0);
          std::__cxx11::string::~string((string *)&local_168);
          std::allocator<char>::~allocator((allocator<char> *)&local_169);
          bVar1 = true;
        }
        std::__cxx11::string::~string((string *)local_128);
        if (bVar1) goto LAB_00787699;
        __gnu_cxx::
        __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
        ::operator++(&local_f8);
      }
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_c8);
      this_02 = cmGeneratorTarget::GetLinkImplementation(this_00,pbVar5);
      psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
      pVar10 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&configs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar8);
      lib._M_current = (cmLinkImplItem *)pVar10.first._M_node;
      local_1d8._M_current =
           (cmLinkImplItem *)
           std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                     ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_02);
      while( true ) {
        local_1e0._M_current =
             (cmLinkImplItem *)
             std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                       ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_02);
        bVar1 = __gnu_cxx::operator!=(&local_1d8,&local_1e0);
        if (!bVar1) break;
        pcVar7 = __gnu_cxx::
                 __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                 ::operator*(&local_1d8);
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&configs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)pcVar7);
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pcVar7 = __gnu_cxx::
                   __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                   ::operator*(&local_1d8);
          AddTargetDepend(this,depender_index,&pcVar7->super_cmLinkItem,true);
          pcVar7 = __gnu_cxx::
                   __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                   ::operator*(&local_1d8);
          AddInterfaceDepends(this,depender_index,&pcVar7->super_cmLinkItem,
                              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&configs.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        __gnu_cxx::
        __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
        ::operator++(&local_1d8);
      }
      bVar1 = false;
LAB_00787699:
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&oi);
      if (bVar1) goto LAB_007876df;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_c8);
    }
    bVar1 = false;
LAB_007876df:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&configs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      emitted_1._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)cmGeneratorTarget::GetUtilityItems(this_00);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_238);
      psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
      pVar10 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_238,psVar8);
      util._M_node = (_Base_ptr)pVar10.first._M_node;
      local_250._M_node =
           (_Base_ptr)
           std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::begin
                     ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                      emitted_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
      while( true ) {
        local_258._M_node =
             (_Base_ptr)
             std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::end
                       ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                        emitted_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar1 = std::operator!=(&local_250,&local_258);
        if (!bVar1) break;
        pcVar9 = std::_Rb_tree_const_iterator<cmLinkItem>::operator*(&local_250);
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_238,&pcVar9->super_string);
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pcVar9 = std::_Rb_tree_const_iterator<cmLinkItem>::operator*(&local_250);
          AddTargetDepend(this,depender_index,pcVar9,false);
        }
        std::_Rb_tree_const_iterator<cmLinkItem>::operator++(&local_250);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_238);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargetDepends(int depender_index)
{
  // Get the depender.
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  if (depender->GetType() == cmState::INTERFACE_LIBRARY)
    {
    return;
    }

  // Loop over all targets linked directly in all configs.
  // We need to make targets depend on the union of all config-specific
  // dependencies in all targets, because the generated build-systems can't
  // deal with config-specific dependencies.
  {
  std::set<std::string> emitted;

  std::vector<std::string> configs;
  depender->Makefile->GetConfigurations(configs);
  if (configs.empty())
    {
    configs.push_back("");
    }
  for (std::vector<std::string>::const_iterator it = configs.begin();
    it != configs.end(); ++it)
    {
    std::vector<cmSourceFile const*> objectFiles;
    depender->GetExternalObjects(objectFiles, *it);
    for(std::vector<cmSourceFile const*>::const_iterator
        oi = objectFiles.begin(); oi != objectFiles.end(); ++oi)
      {
      std::string objLib = (*oi)->GetObjectLibrary();
      if (!objLib.empty() && emitted.insert(objLib).second)
        {
        if(depender->GetType() != cmState::EXECUTABLE &&
            depender->GetType() != cmState::STATIC_LIBRARY &&
            depender->GetType() != cmState::SHARED_LIBRARY &&
            depender->GetType() != cmState::MODULE_LIBRARY)
          {
          this->GlobalGenerator->GetCMakeInstance()
            ->IssueMessage(cmake::FATAL_ERROR,
                            "Only executables and non-OBJECT libraries may "
                            "reference target objects.",
                            depender->GetBacktrace());
          return;
          }
        const_cast<cmGeneratorTarget*>(depender)->Target->AddUtility(objLib);
        }
      }

    cmLinkImplementation const* impl = depender->GetLinkImplementation(*it);

    // A target should not depend on itself.
    emitted.insert(depender->GetName());
    for(std::vector<cmLinkImplItem>::const_iterator
          lib = impl->Libraries.begin();
        lib != impl->Libraries.end(); ++lib)
      {
      // Don't emit the same library twice for this target.
      if(emitted.insert(*lib).second)
        {
        this->AddTargetDepend(depender_index, *lib, true);
        this->AddInterfaceDepends(depender_index, *lib, emitted);
        }
      }
    }
  }

  // Loop over all utility dependencies.
  {
  std::set<cmLinkItem> const& tutils = depender->GetUtilityItems();
  std::set<std::string> emitted;
  // A target should not depend on itself.
  emitted.insert(depender->GetName());
  for(std::set<cmLinkItem>::const_iterator util = tutils.begin();
      util != tutils.end(); ++util)
    {
    // Don't emit the same utility twice for this target.
    if(emitted.insert(*util).second)
      {
      this->AddTargetDepend(depender_index, *util, false);
      }
    }
  }
}